

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void __thiscall testing::Sequence::AddExpectation(Sequence *this,Expectation *expectation)

{
  bool bVar1;
  Expectation *pEVar2;
  linked_ptr<testing::internal::ExpectationBase> *plVar3;
  ExpectationBase *pEVar4;
  Expectation *expectation_local;
  Sequence *this_local;
  
  pEVar2 = internal::linked_ptr<testing::Expectation>::operator*(&this->last_expectation_);
  bVar1 = Expectation::operator!=(pEVar2,expectation);
  if (bVar1) {
    pEVar2 = internal::linked_ptr<testing::Expectation>::operator->(&this->last_expectation_);
    plVar3 = Expectation::expectation_base(pEVar2);
    bVar1 = internal::linked_ptr<testing::internal::ExpectationBase>::operator!=
                      (plVar3,(ExpectationBase *)0x0);
    if (bVar1) {
      pEVar2 = internal::linked_ptr<testing::Expectation>::operator*(&this->last_expectation_);
      plVar3 = Expectation::expectation_base(expectation);
      pEVar4 = internal::linked_ptr<testing::internal::ExpectationBase>::operator->(plVar3);
      ExpectationSet::operator+=(&pEVar4->immediate_prerequisites_,pEVar2);
    }
    pEVar2 = internal::linked_ptr<testing::Expectation>::operator*(&this->last_expectation_);
    Expectation::operator=(pEVar2,expectation);
  }
  return;
}

Assistant:

void Sequence::AddExpectation(const Expectation& expectation) const {
  if (*last_expectation_ != expectation) {
    if (last_expectation_->expectation_base() != NULL) {
      expectation.expectation_base()->immediate_prerequisites_
          += *last_expectation_;
    }
    *last_expectation_ = expectation;
  }
}